

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph-opt.cpp
# Opt level: O0

void buildJobs(Options *Opts,ParseResult *Result)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ParseResult *pPVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  OptionValue *pOVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  size_type sVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  Program *Prog;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7c8;
  string local_770;
  ostream local_750 [8];
  ofstream OutTgtFileStream;
  undefined1 local_550 [8];
  Parser parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *S;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_508;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_4e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *V;
  string local_4d8;
  string local_4b8;
  allocator local_491;
  string local_490;
  allocator local_469;
  string local_468;
  allocator local_441;
  string local_440 [8];
  string OutTgtSrc;
  string local_418;
  allocator local_3f1;
  string local_3f0;
  allocator local_3c9;
  undefined1 local_3c8 [8];
  string TgtLang;
  fpos<__mbstate_t> local_398;
  fpos local_388 [16];
  streamoff local_378;
  size_t Size;
  filebuf *FileBuf;
  string local_360;
  string local_340 [8];
  string PhSrcFile;
  string local_318;
  char *local_2f8;
  char *InPhTokens;
  ifstream InPhFileStream;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e4;
  undefined1 local_e3;
  allocator local_e2;
  allocator local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8 [32];
  iterator local_98;
  size_type local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  allocator local_39;
  string local_38;
  ParseResult *local_18;
  ParseResult *Result_local;
  Options *Opts_local;
  
  local_18 = Result;
  Result_local = (ParseResult *)Opts;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"help",&local_39);
  sVar5 = cxxopts::ParseResult::count(Result,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pPVar1 = Result_local;
  if (sVar5 != 0) {
    local_e3 = 1;
    local_e0 = &local_d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"",&local_e1);
    local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Group",&local_e2);
    local_e3 = 0;
    local_98 = &local_d8;
    local_90 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_e4);
    __l._M_len = local_90;
    __l._M_array = local_98;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_88,__l,&local_e4);
    cxxopts::Options::help(&local_70,(Options *)pPVar1,&local_88);
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)&local_70);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_e4);
    local_7c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98;
    do {
      local_7c8 = local_7c8 + -1;
      std::__cxx11::string::~string((string *)local_7c8);
    } while (local_7c8 != &local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e2);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    exit(0);
  }
  std::ifstream::ifstream(&InPhTokens);
  pPVar1 = local_18;
  local_2f8 = (char *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_318,"input",(allocator *)(PhSrcFile.field_2._M_local_buf + 0xf));
  sVar5 = cxxopts::ParseResult::count(pPVar1,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator((allocator<char> *)(PhSrcFile.field_2._M_local_buf + 0xf));
  pPVar1 = local_18;
  if (sVar5 == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"ph-opt");
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = std::operator<<(poVar6,"\x1b[31m error: \x1b[0m");
    std::operator<<(poVar6,"No input files! Usage see option \'--help\'.\n");
    exit(-1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_360,"input",(allocator *)((long)&FileBuf + 7));
  pOVar7 = cxxopts::ParseResult::operator[](pPVar1,&local_360);
  pbVar8 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar7);
  std::__cxx11::string::string(local_340,(string *)pbVar8);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator((allocator<char> *)((long)&FileBuf + 7));
  std::ifstream::open((string *)&InPhTokens,(_Ios_Openmode)local_340);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"ph-opt");
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = std::operator<<(poVar6,"\x1b[31m error: \x1b[0m");
    poVar6 = std::operator<<(poVar6,"Fail to open ");
    poVar6 = std::operator<<(poVar6,local_340);
    std::operator<<(poVar6,'\n');
    exit(-1);
  }
  Size = std::ifstream::rdbuf();
  local_388 = (fpos  [16])std::streambuf::pubseekoff(Size,_S_beg,_S_ate);
  local_378 = std::fpos::operator_cast_to_long(local_388);
  sVar5 = Size;
  std::fpos<__mbstate_t>::fpos(&local_398,0);
  TgtLang.field_2._8_8_ = std::streambuf::pubseekpos(sVar5,local_398._M_off,local_398._M_state,8);
  local_2f8 = (char *)operator_new__(local_378 + 1);
  std::streambuf::sgetn((char *)Size,(long)local_2f8);
  local_2f8[local_378] = '\0';
  std::ifstream::close();
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_3c8,"",&local_3c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f0,"lang",&local_3f1);
  sVar5 = cxxopts::ParseResult::count(pPVar1,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  pPVar1 = local_18;
  if (sVar5 == 0) {
    std::__cxx11::string::operator=((string *)local_3c8,"OpenMP");
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_418,"lang",(allocator *)(OutTgtSrc.field_2._M_local_buf + 0xf));
    pOVar7 = cxxopts::ParseResult::operator[](pPVar1,&local_418);
    pbVar8 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar7);
    std::__cxx11::string::operator=((string *)local_3c8,(string *)pbVar8);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator((allocator<char> *)(OutTgtSrc.field_2._M_local_buf + 0xf));
    phaeton::toUpperCase((string *)local_3c8);
    sVar9 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&VALID_TARGET_LANG_abi_cxx11_,(key_type *)local_3c8);
    if (sVar9 == 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"ph-opt");
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = std::operator<<(poVar6,"\x1b[31m error: \x1b[0m");
      std::operator<<(poVar6,
                      "Unknown target language! Now only support \'Numpy, OpenMP, OpenCL, Cuda, Bang, CCE, TPU\'.\n"
                     );
      exit(-1);
    }
  }
  phaeton::toUpperCase((string *)local_3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_440,"",&local_441);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_468,"output",&local_469);
  sVar5 = cxxopts::ParseResult::count(pPVar1,&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  pPVar1 = local_18;
  if (sVar5 == 0) {
    getDefaultOutputFileName(&local_4b8,(string *)local_3c8);
    std::__cxx11::string::operator=(local_440,(string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_4b8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_490,"output",&local_491);
    pOVar7 = cxxopts::ParseResult::operator[](pPVar1,&local_490);
    pbVar8 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar7);
    std::__cxx11::string::operator=(local_440,(string *)pbVar8);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
  }
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d8,"positional",(allocator *)((long)&V + 7));
  sVar5 = cxxopts::ParseResult::count(pPVar1,&local_4d8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&V + 7));
  if (sVar5 != 0) {
    std::operator<<((ostream *)&std::cout,"Positional = {");
    pPVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_508,"positional",(allocator *)((long)&__range2 + 7));
    pOVar7 = cxxopts::ParseResult::operator[](pPVar1,&local_508);
    this = cxxopts::OptionValue::
           as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(pOVar7);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    local_4e8 = this;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this);
    S = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&S);
      if (!bVar3) break;
      parser.AST = (Program *)
                   __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
      poVar6 = std::operator<<((ostream *)&std::cout,(string *)parser.AST);
      std::operator<<(poVar6,", ");
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"}");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  phaeton::Parser::Parser((Parser *)local_550,local_2f8);
  iVar4 = phaeton::Parser::parse((Parser *)local_550);
  if (iVar4 == 0) {
    if (local_2f8 != (char *)0x0) {
      operator_delete__(local_2f8);
    }
    std::ofstream::ofstream(local_750,local_440,_S_out);
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) != 0) {
      getTargetLanguageCode(&local_770,(Parser *)local_550,(string *)local_3c8);
      std::operator<<(local_750,(string *)&local_770);
      std::__cxx11::string::~string((string *)&local_770);
      std::ofstream::close();
      Prog = phaeton::Parser::getAST((Parser *)local_550);
      phaeton::Program::destroy(Prog);
      std::ofstream::~ofstream(local_750);
      phaeton::Parser::~Parser((Parser *)local_550);
      std::__cxx11::string::~string(local_440);
      std::__cxx11::string::~string((string *)local_3c8);
      std::ifstream::~ifstream(&InPhTokens);
      return;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"ph-opt");
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = std::operator<<(poVar6,"\x1b[31m error: \x1b[0m");
    poVar6 = std::operator<<(poVar6,"Fail to open file ");
    poVar6 = std::operator<<(poVar6,local_440);
    std::operator<<(poVar6,'\n');
    exit(-1);
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"ph-opt");
  poVar6 = std::operator<<(poVar6,":");
  poVar6 = std::operator<<(poVar6,"\x1b[31m error: \x1b[0m");
  std::operator<<(poVar6,"Fail to parse input Phaeton tokens\n");
  exit(-1);
}

Assistant:

void buildJobs(const Options &Opts, const ParseResult &Result) {
  // Dump the help text message
  if (Result.count("help")) {
    std::cout << Opts.help({"", "Group"}) << std::endl;
    exit(EXIT_SUCCESS);
  }

  std::ifstream InPhFileStream;
  char *InPhTokens = NULL;

  // If we get here, that means, we don't pass the 'help' option,
  // so the user must have at least one input.
  if (Result.count("input")) {
    std::string PhSrcFile = Result["input"].as<std::string>();
    InPhFileStream.open(PhSrcFile);
    // Fail to open input source file.
    if (!InPhFileStream.is_open()) {
      std::cerr << PH_OPTIMIZER_EXE << ":" << FRED(" error: ")
                << "Fail to open " << PhSrcFile << '\n';
      exit(-1);
    }
    std::filebuf *FileBuf = InPhFileStream.rdbuf();
    std::size_t Size =
        FileBuf->pubseekoff(0, InPhFileStream.end, InPhFileStream.in);
    FileBuf->pubseekpos(0, InPhFileStream.in);

    InPhTokens = new char[Size + 1];
    FileBuf->sgetn(InPhTokens, Size);
    InPhTokens[Size] = 0;
    InPhFileStream.close();
  } else {
    std::cerr << PH_OPTIMIZER_EXE << ":" << FRED(" error: ")
              << "No input files! Usage see option '--help'.\n";
    exit(-1);
  }

  // Then we need to determine the final phase.

  std::string TgtLang = "";
  // If we get here, that means we need to translate Phaeton into target
  // language.
  if (Result.count("lang")) {
    TgtLang = Result["lang"].as<std::string>();
    // Uniform use of upper case
    toUpperCase(TgtLang);
    if (!VALID_TARGET_LANG.count(TgtLang)) {
      std::cerr << PH_OPTIMIZER_EXE << ":" << FRED(" error: ")
                << "Unknown target language! Now only support 'Numpy, OpenMP, "
                   "OpenCL, Cuda, Bang, CCE, TPU'.\n";
      exit(-1);
    }
  } else {
    // Default target language is OpenMP
    TgtLang = "OpenMP";
  }
  // Uniform use of upper case
  toUpperCase(TgtLang);

  std::string OutTgtSrc = "";
  // If we get here, that means we have already get the target language.
  if (Result.count("output")) {
    OutTgtSrc = Result["output"].as<std::string>();
  } else {
    // Default output name.
    OutTgtSrc = getDefaultOutputFileName(TgtLang);
  }

  if (Result.count("positional")) {
    std::cout << "Positional = {";
    auto &V = Result["positional"].as<std::vector<std::string>>();
    for (const auto &S : V) {
      std::cout << S << ", ";
    }
    std::cout << "}" << std::endl;
  }

  // If we get here, that means we have to perform translation to
  // translate Phaeton input source file into the target language
  // output.
  Parser parser(InPhTokens);
  if (parser.parse()) {
    std::cerr << PH_OPTIMIZER_EXE << ":" << FRED(" error: ")
              << "Fail to parse input Phaeton tokens\n";
    exit(-1);
  }
  // parser.getAST()->dump();
  delete[] InPhTokens;

  std::ofstream OutTgtFileStream(OutTgtSrc);
  if (OutTgtFileStream.is_open()) {
    OutTgtFileStream << getTargetLanguageCode(parser, TgtLang);
    OutTgtFileStream.close();
  } else {
    std::cerr << PH_OPTIMIZER_EXE << ":" << FRED(" error: ")
              << "Fail to open file " << OutTgtSrc << '\n';
    exit(-1);
  }
  Program::destroy(parser.getAST());
}